

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliReader.cpp
# Opt level: O0

void __thiscall cali::CaliReader::CaliReader(CaliReader *this)

{
  CaliReaderImpl *this_00;
  CaliReader *this_local;
  
  this_00 = (CaliReaderImpl *)operator_new(0x30);
  CaliReaderImpl::CaliReaderImpl(this_00);
  std::
  unique_ptr<cali::CaliReader::CaliReaderImpl,std::default_delete<cali::CaliReader::CaliReaderImpl>>
  ::unique_ptr<std::default_delete<cali::CaliReader::CaliReaderImpl>,void>
            ((unique_ptr<cali::CaliReader::CaliReaderImpl,std::default_delete<cali::CaliReader::CaliReaderImpl>>
              *)this,this_00);
  return;
}

Assistant:

CaliReader::CaliReader() : mP { new CaliReaderImpl() }
{}